

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Performance::TextureUploadCase::logResults(TextureUploadCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostringstream *poVar3;
  int iVar4;
  int iVar5;
  TestLog *pTVar6;
  TestContext *this_00;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  deUint64 dVar10;
  int precision;
  char *pcVar11;
  int iVar12;
  void *pvVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedFrameTimes;
  string local_268;
  string local_248;
  string local_228;
  double local_208;
  float local_200;
  int local_1fc;
  double local_1f8;
  double dStack_1f0;
  void *local_1e0;
  void *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  qpKeyValueTag local_168;
  float local_164;
  ios_base local_150 [264];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pTVar6 = this->m_log;
  paVar1 = &local_248.field_2;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Measurement details","");
  paVar2 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Measurement details","");
  tcu::LogSection::LogSection((LogSection *)local_1c8,&local_248,&local_268);
  tcu::TestLog::startSection(pTVar6,(char *)local_1c8._0_8_,local_1a8._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_1c8._0_8_ = this->m_log;
  poVar3 = (ostringstream *)(local_1c8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Uploading texture with ",0x17);
  bVar14 = this->m_uploadFunction != UPLOAD_TEXIMAGE2D;
  pcVar11 = "glTexSubImage2D";
  if (!bVar14) {
    pcVar11 = "glTexImage2D";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,pcVar11,(ulong)bVar14 * 3 + 0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_150);
  local_1c8._0_8_ = this->m_log;
  poVar3 = (ostringstream *)(local_1c8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Texture size = ",0xf);
  std::ostream::operator<<(poVar3,this->m_texSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"x",1);
  std::ostream::operator<<(poVar3,this->m_texSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_150);
  local_1c8._0_8_ = this->m_log;
  poVar3 = (ostringstream *)(local_1c8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Viewport size = ",0x10);
  std::ostream::operator<<(poVar3,0x40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"x",1);
  std::ostream::operator<<(poVar3,0x40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_150);
  local_1c8._0_8_ = this->m_log;
  poVar3 = (ostringstream *)(local_1c8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::ostream::operator<<(poVar3,(this->m_calibrator).m_measureState.numDrawCalls);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3," upload calls / iteration",0x19);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_150);
  tcu::TestLog::endSection(this->m_log);
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Results","");
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Results","");
  tcu::LogSection::LogSection((LogSection *)local_1c8,&local_248,&local_268);
  tcu::TestLog::startSection(pTVar6,(char *)local_1c8._0_8_,local_1a8._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  std::vector<unsigned_long,std::allocator<unsigned_long>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1e0,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(this->m_calibrator).m_measureState.frameTimes.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(this->m_calibrator).m_measureState.frameTimes.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_1c8);
  pvVar8 = local_1d8;
  pvVar13 = local_1e0;
  if (local_1e0 != local_1d8) {
    uVar9 = (long)local_1d8 - (long)local_1e0 >> 3;
    lVar7 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_1e0,local_1d8,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar13,pvVar8);
    pvVar13 = local_1d8;
  }
  local_1fc = this->m_texSize * this->m_texSize * (this->m_calibrator).m_measureState.numDrawCalls;
  local_48 = *(undefined8 *)
              ((long)local_1e0 +
              (((long)pvVar13 - (long)local_1e0 >> 3) - ((long)pvVar13 - (long)local_1e0 >> 0x3f) &
              0xfffffffffffffffeU) * 4);
  uStack_40 = 0;
  dVar10 = deqp::gls::MeasureState::getTotalTime(&(this->m_calibrator).m_measureState);
  iVar4 = (this->m_calibrator).m_measureState.numDrawCalls;
  iVar12 = (int)((ulong)((long)(this->m_calibrator).m_measureState.frameTimes.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_calibrator).m_measureState.frameTimes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  iVar5 = this->m_texSize;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"FramesPerSecond","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Frames per second in measurement\t\t","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Frames/s","");
  local_208 = (double)iVar12;
  auVar15._8_4_ = (int)(dVar10 >> 0x20);
  auVar15._0_8_ = dVar10;
  auVar15._12_4_ = 0x45300000;
  dStack_1f0 = auVar15._8_8_ - 1.9342813113834067e+25;
  local_1f8 = dStack_1f0 + ((double)CONCAT44(0x43300000,(int)dVar10) - 4503599627370496.0);
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1c8,&local_248,&local_268,&local_228,QP_KEY_TAG_PERFORMANCE,
             (float)(local_208 / (local_1f8 / 1000000.0)));
  paVar1 = &local_248.field_2;
  tcu::TestLog::writeFloat
            (pTVar6,(char *)local_1c8._0_8_,local_1a8._M_p,local_188._M_p,local_168,local_164);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_p != &local_178) {
    operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"AverageFrameTime","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Average frame duration in measurement\t","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"us","");
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1c8,&local_248,&local_268,&local_228,QP_KEY_TAG_PERFORMANCE,
             (float)(local_1f8 / local_208));
  tcu::TestLog::writeFloat
            (pTVar6,(char *)local_1c8._0_8_,local_1a8._M_p,local_188._M_p,local_168,local_164);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_p != &local_178) {
    operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"AverageTexelPerf","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Average texel upload performance\t\t","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"MTex/s","");
  local_208 = (double)((long)iVar5 * (long)iVar5 * (long)(iVar4 * iVar12));
  local_200 = (float)(local_208 / local_1f8);
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1c8,&local_248,&local_268,&local_228,QP_KEY_TAG_PERFORMANCE,
             local_200);
  paVar2 = &local_268.field_2;
  tcu::TestLog::writeFloat
            (pTVar6,(char *)local_1c8._0_8_,local_1a8._M_p,local_188._M_p,local_168,local_164);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_p != &local_178) {
    operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"AverageTexelTime","");
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Average texel upload duration\t\t","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"ns","");
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1c8,&local_248,&local_268,&local_228,QP_KEY_TAG_PERFORMANCE,
             (float)((local_1f8 * 1000.0) / local_208));
  tcu::TestLog::writeFloat
            (pTVar6,(char *)local_1c8._0_8_,local_1a8._M_p,local_188._M_p,local_168,local_164);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_p != &local_178) {
    operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MedianTexelPerf","");
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Median texel upload performance\t\t","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"MTex/s","");
  auVar17._12_4_ = (undefined4)((ulong)uStack_40 >> 0x20);
  auVar17._8_4_ = (int)((ulong)local_48 >> 0x20);
  auVar17._0_8_ = local_48;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._0_8_ = (double)CONCAT44(0x43300000,(int)local_48);
  auVar18._0_12_ = auVar16._0_12_;
  auVar18._12_4_ = 0x45300000;
  dStack_1f0 = auVar18._8_8_ - 1.9342813113834067e+25;
  local_1f8 = dStack_1f0 + (auVar16._0_8_ - 4503599627370496.0);
  local_208 = (double)local_1fc;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1c8,&local_248,&local_268,&local_228,QP_KEY_TAG_PERFORMANCE,
             (float)(local_208 / local_1f8));
  tcu::TestLog::writeFloat
            (pTVar6,(char *)local_1c8._0_8_,local_1a8._M_p,local_188._M_p,local_168,local_164);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_p != &local_178) {
    operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MedianTexelTime","");
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Median texel upload duration\t\t","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"ns","");
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1c8,&local_248,&local_268,&local_228,QP_KEY_TAG_PERFORMANCE,
             (float)((local_1f8 * 1000.0) / local_208));
  tcu::TestLog::writeFloat
            (pTVar6,(char *)local_1c8._0_8_,local_1a8._M_p,local_188._M_p,local_168,local_164);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_p != &local_178) {
    operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection(pTVar6);
  deqp::gls::logCalibrationInfo(pTVar6,&this->m_calibrator);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  de::floatToString_abi_cxx11_((string *)local_1c8,(de *)0x2,local_200,precision);
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_1c8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if (local_1e0 != (void *)0x0) {
    operator_delete(local_1e0,local_1d0 - (long)local_1e0);
  }
  return;
}

Assistant:

void TextureUploadCase::logResults (void)
{
	const gls::MeasureState& measureState = m_calibrator.getMeasureState();

	// Log measurement details

	m_log << TestLog::Section("Measurement details", "Measurement details");
	m_log << TestLog::Message << "Uploading texture with " << (m_uploadFunction == UPLOAD_TEXIMAGE2D ? "glTexImage2D" : "glTexSubImage2D") << "." << TestLog::EndMessage; // \todo [arttu] Change enum to struct with name included
	m_log << TestLog::Message << "Texture size = "	<< m_texSize	 << "x" << m_texSize	 << "." << TestLog::EndMessage;
	m_log << TestLog::Message << "Viewport size = " << VIEWPORT_SIZE << "x" << VIEWPORT_SIZE << "." << TestLog::EndMessage;
	m_log << TestLog::Message << measureState.numDrawCalls << " upload calls / iteration" << TestLog::EndMessage;
	m_log << TestLog::EndSection;

	// Log results

	TestLog& log = m_testCtx.getLog();
	log << TestLog::Section("Results", "Results");

	// Log individual frame durations
	//for (int i = 0; i < m_calibrator.measureState.numFrames; i++)
	//	m_log << TestLog::Message	<< "Frame "	<< i+1 << " duration: \t" << m_calibrator.measureState.frameTimes[i] << " us."<< TestLog::EndMessage;

	std::vector<deUint64> sortedFrameTimes(measureState.frameTimes.begin(), measureState.frameTimes.end());
	std::sort(sortedFrameTimes.begin(), sortedFrameTimes.end());
	vector<deUint64>::const_iterator first	= sortedFrameTimes.begin();
	vector<deUint64>::const_iterator last	= sortedFrameTimes.end();
	vector<deUint64>::const_iterator middle	= first + (last - first) / 2;

	deUint64 medianFrameTime			=  *middle;
	double medianMTexelsPerSeconds		= (double)(m_texSize*m_texSize*measureState.numDrawCalls) / (double)medianFrameTime;
	double medianTexelDrawDurationNs	= (double)medianFrameTime * 1000.0 / (double)(m_texSize*m_texSize*measureState.numDrawCalls);

	deUint64	totalTime			= measureState.getTotalTime();
	int			numFrames			= (int)measureState.frameTimes.size();
	deInt64		numTexturesDrawn	= measureState.numDrawCalls * numFrames;
	deInt64		numPixels			= (deInt64)m_texSize * (deInt64)m_texSize * numTexturesDrawn;

	double		framesPerSecond			= (double)numFrames / ((double)totalTime / 1000000.0);
	double		avgFrameTime			= (double)totalTime / (double)numFrames;
	double		avgMTexelsPerSeconds	= (double)numPixels / (double)totalTime;
	double		avgTexelDrawDurationNs	= (double)totalTime * 1000.0 / (double)numPixels;

	log << TestLog::Float("FramesPerSecond",	"Frames per second in measurement\t\t",		"Frames/s",		QP_KEY_TAG_PERFORMANCE,	(float)framesPerSecond);
	log << TestLog::Float("AverageFrameTime",	"Average frame duration in measurement\t",	"us",			QP_KEY_TAG_PERFORMANCE,	(float)avgFrameTime);
	log << TestLog::Float("AverageTexelPerf",	"Average texel upload performance\t\t",		"MTex/s",		QP_KEY_TAG_PERFORMANCE,	(float)avgMTexelsPerSeconds);
	log << TestLog::Float("AverageTexelTime",	"Average texel upload duration\t\t",		"ns",			QP_KEY_TAG_PERFORMANCE,	(float)avgTexelDrawDurationNs);
	log << TestLog::Float("MedianTexelPerf",	"Median texel upload performance\t\t",		"MTex/s",		QP_KEY_TAG_PERFORMANCE,	(float)medianMTexelsPerSeconds);
	log << TestLog::Float("MedianTexelTime",	"Median texel upload duration\t\t",			"ns",			QP_KEY_TAG_PERFORMANCE,	(float)medianTexelDrawDurationNs);

	log << TestLog::EndSection;

	gls::logCalibrationInfo(log, m_calibrator);	// Log calibration details
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)avgMTexelsPerSeconds, 2).c_str());
}